

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

Var Js::JavascriptString::
    DelegateToRegExSymbolFunction<2,Js::JavascriptString::EntryReplace(Js::RecyclableObject*,Js::CallInfo,___)::__0>
              (ArgumentReader *args,PropertyId symbolPropertyId,anon_class_24_3_c74cef3c fallback,
              PCWSTR varName,ScriptContext *scriptContext)

{
  bool bVar1;
  BOOL BVar2;
  ScriptConfiguration *this;
  Var pvVar3;
  JavascriptString *local_48;
  JavascriptString *pThis;
  Var symbolFn;
  Var regExp;
  ScriptContext *scriptContext_local;
  PCWSTR varName_local;
  Arguments *pAStack_18;
  PropertyId symbolPropertyId_local;
  ArgumentReader *args_local;
  
  regExp = scriptContext;
  scriptContext_local = (ScriptContext *)varName;
  varName_local._4_4_ = symbolPropertyId;
  pAStack_18 = &args->super_Arguments;
  this = ScriptContext::GetConfig(scriptContext);
  bVar1 = ScriptConfiguration::IsES6RegExSymbolsEnabled(this);
  if (!bVar1) {
LAB_0132686d:
    local_48 = (JavascriptString *)0x0;
    GetThisStringArgument
              ((ArgumentReader *)pAStack_18,(ScriptContext *)regExp,(char16 *)scriptContext_local,
               &local_48);
    pvVar3 = EntryReplace::anon_class_24_3_c74cef3c::operator()(&fallback,local_48);
    return pvVar3;
  }
  if (((ulong)pAStack_18->Info & 0xffffff) != 0) {
    pvVar3 = Arguments::operator[](pAStack_18,0);
    BVar2 = JavascriptConversion::CheckObjectCoercible(pvVar3,(ScriptContext *)regExp);
    if (BVar2 != 0) {
      if (1 < (SUB84(pAStack_18->Info,0) & 0xffffff)) {
        pvVar3 = Arguments::operator[](pAStack_18,1);
        BVar2 = Js::JavascriptOperators::IsUndefinedOrNull(pvVar3);
        if (BVar2 == 0) {
          symbolFn = Arguments::operator[](pAStack_18,1);
          pThis = (JavascriptString *)
                  GetRegExSymbolFunction(symbolFn,varName_local._4_4_,(ScriptContext *)regExp);
          BVar2 = Js::JavascriptOperators::IsUndefinedOrNull(pThis);
          if (BVar2 == 0) {
            pvVar3 = CallRegExSymbolFunction<2>
                               (pThis,symbolFn,pAStack_18,(PCWSTR)scriptContext_local,
                                (ScriptContext *)regExp);
            return pvVar3;
          }
        }
      }
      goto LAB_0132686d;
    }
  }
  JavascriptError::ThrowTypeError((ScriptContext *)regExp,-0x7ff5ec42,(PCWSTR)scriptContext_local);
}

Assistant:

Var JavascriptString::DelegateToRegExSymbolFunction(ArgumentReader &args, PropertyId symbolPropertyId, FallbackFn fallback, PCWSTR varName, ScriptContext* scriptContext)
    {
        if (scriptContext->GetConfig()->IsES6RegExSymbolsEnabled())
        {
            if (args.Info.Count == 0 || !JavascriptConversion::CheckObjectCoercible(args[0], scriptContext))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, varName);
            }

            if (args.Info.Count >= 2 && !JavascriptOperators::IsUndefinedOrNull(args[1]))
            {
                Var regExp = args[1];
                Var symbolFn = GetRegExSymbolFunction(regExp, symbolPropertyId, scriptContext);
                if (!JavascriptOperators::IsUndefinedOrNull(symbolFn))
                {
                    return CallRegExSymbolFunction<argCount>(symbolFn, regExp, args, varName, scriptContext);
                }
            }
        }

        JavascriptString * pThis = nullptr;
        GetThisStringArgument(args, scriptContext, varName, &pThis);
        return fallback(pThis);
    }